

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_1::WatWriter::WriteField(WatWriter *this,Field *field)

{
  if (field->mutable_ == true) {
    WritePuts(this,"(",None);
    WritePuts(this,"mut",Space);
    this->indent_ = this->indent_ + 2;
  }
  WriteType(this,field->type,Space);
  if (field->mutable_ == true) {
    WriteClose(this,Space);
    return;
  }
  return;
}

Assistant:

void WatWriter::WriteField(const Field& field) {
  if (field.mutable_) {
    WriteOpenSpace("mut");
  }
  WriteType(field.type, NextChar::Space);
  if (field.mutable_) {
    WriteCloseSpace();
  }
}